

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_detect_magic(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  bVar1 = is_affected_by((CHAR_DATA *)vo,4);
  if (!bVar1) {
    init_affect(&AStack_98);
    AStack_98.where = 0;
    AStack_98.aftype = get_spell_aftype(ch);
    AStack_98.type = (short)sn;
    AStack_98.location = 0;
    AStack_98.modifier = 0;
    AStack_98.bitvector[0]._0_1_ = (byte)AStack_98.bitvector[0] | 0x10;
    AStack_98.mod_name = 0;
    AStack_98.level = (short)level;
    AStack_98.duration = (short)level;
    affect_to_char((CHAR_DATA *)vo,&AStack_98);
    send_to_char("Your eyes tingle.\n\r",(CHAR_DATA *)vo);
    if (ch != (CHAR_DATA *)vo) {
      send_to_char("Ok.\n\r",ch);
    }
    return;
  }
  if ((CHAR_DATA *)vo != ch) {
    act("$N can already detect magic.",ch,(void *)0x0,vo,3);
    return;
  }
  send_to_char("You can already sense magical auras.\n\r",ch);
  return;
}

Assistant:

void spell_detect_magic(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected_by(victim, AFF_DETECT_MAGIC))
	{
		if (victim == ch)
			send_to_char("You can already sense magical auras.\n\r", ch);
		else
			act("$N can already detect magic.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level;
	af.modifier = 0;
	af.location = APPLY_NONE;

	SET_BIT(af.bitvector, AFF_DETECT_MAGIC);

	af.mod_name = MOD_VISION;
	affect_to_char(victim, &af);

	send_to_char("Your eyes tingle.\n\r", victim);

	if (ch != victim)
		send_to_char("Ok.\n\r", ch);
}